

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O1

REF_STATUS ref_oct_tattle(REF_OCT ref_oct,REF_INT node)

{
  REF_INT *pRVar1;
  long lVar2;
  
  pRVar1 = ref_oct->nodes;
  lVar2 = (long)(node * 0x1b);
  printf("corners %d %d %d %d  %d %d %d %d\n",(ulong)(uint)pRVar1[lVar2],
         (ulong)(uint)pRVar1[lVar2 + 1],(ulong)(uint)pRVar1[lVar2 + 2],
         (ulong)(uint)pRVar1[lVar2 + 3],(ulong)(uint)pRVar1[lVar2 + 4],
         (ulong)(uint)pRVar1[lVar2 + 5],(ulong)(uint)pRVar1[lVar2 + 6],
         (ulong)(uint)pRVar1[lVar2 + 7]);
  pRVar1 = ref_oct->nodes;
  printf("edges %d %d %d %d  %d %d %d %d  %d %d %d %d\n",(ulong)(uint)pRVar1[lVar2 + 8],
         (ulong)(uint)pRVar1[lVar2 + 9],(ulong)(uint)pRVar1[lVar2 + 10],
         (ulong)(uint)pRVar1[lVar2 + 0xb],(ulong)(uint)pRVar1[lVar2 + 0xc],
         (ulong)(uint)pRVar1[lVar2 + 0xd],(ulong)(uint)pRVar1[lVar2 + 0xe],
         (ulong)(uint)pRVar1[lVar2 + 0xf],(ulong)(uint)pRVar1[lVar2 + 0x10],
         (ulong)(uint)pRVar1[lVar2 + 0x11],(ulong)(uint)pRVar1[lVar2 + 0x12],
         (ulong)(uint)pRVar1[lVar2 + 0x13]);
  pRVar1 = ref_oct->nodes;
  printf("faces %d  %d %d %d %d  %d center %d\n",(ulong)(uint)pRVar1[lVar2 + 0x14],
         (ulong)(uint)pRVar1[lVar2 + 0x15],(ulong)(uint)pRVar1[lVar2 + 0x16],
         (ulong)(uint)pRVar1[lVar2 + 0x17],(ulong)(uint)pRVar1[lVar2 + 0x18],
         (ulong)(uint)pRVar1[lVar2 + 0x19],(ulong)(uint)pRVar1[lVar2 + 0x1a]);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_oct_tattle(REF_OCT ref_oct, REF_INT node) {
  printf("corners %d %d %d %d  %d %d %d %d\n", ref_oct_c2n(ref_oct, 0, node),
         ref_oct_c2n(ref_oct, 1, node), ref_oct_c2n(ref_oct, 2, node),
         ref_oct_c2n(ref_oct, 3, node), ref_oct_c2n(ref_oct, 4, node),
         ref_oct_c2n(ref_oct, 5, node), ref_oct_c2n(ref_oct, 6, node),
         ref_oct_c2n(ref_oct, 7, node));
  printf("edges %d %d %d %d  %d %d %d %d  %d %d %d %d\n",
         ref_oct_c2n(ref_oct, 8, node), ref_oct_c2n(ref_oct, 9, node),
         ref_oct_c2n(ref_oct, 10, node), ref_oct_c2n(ref_oct, 11, node),
         ref_oct_c2n(ref_oct, 12, node), ref_oct_c2n(ref_oct, 13, node),
         ref_oct_c2n(ref_oct, 14, node), ref_oct_c2n(ref_oct, 15, node),
         ref_oct_c2n(ref_oct, 16, node), ref_oct_c2n(ref_oct, 17, node),
         ref_oct_c2n(ref_oct, 18, node), ref_oct_c2n(ref_oct, 19, node));
  printf("faces %d  %d %d %d %d  %d center %d\n",
         ref_oct_c2n(ref_oct, 20, node), ref_oct_c2n(ref_oct, 21, node),
         ref_oct_c2n(ref_oct, 22, node), ref_oct_c2n(ref_oct, 23, node),
         ref_oct_c2n(ref_oct, 24, node), ref_oct_c2n(ref_oct, 25, node),
         ref_oct_c2n(ref_oct, 26, node));
  return REF_SUCCESS;
}